

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int set_sort(lyxp_set *set)

{
  bool bVar1;
  lyxp_node_type lVar2;
  uint32_t uVar3;
  bool bVar4;
  LY_ERR LVar5;
  int iVar6;
  uint32_t uVar7;
  lyxp_set_node *plVar8;
  lyxp_set_node *plVar9;
  uint64_t hash;
  lyxp_set_hash_node hnode;
  lyxp_set_node item;
  lyd_node *root;
  ly_bool change;
  uint uStack_24;
  ly_bool inverted;
  int cmp;
  int ret;
  uint32_t j;
  uint32_t i;
  lyxp_set *set_local;
  
  uStack_24 = 0;
  if ((set->type == LYXP_SET_NODE_SET) && (1 < set->used)) {
    for (item._8_8_ = set->tree; *(long *)(item._8_8_ + 0x10) != 0;
        item._8_8_ = lyd_parent((lyd_node *)item._8_8_)) {
    }
    while (*(long *)(*(long *)(item._8_8_ + 0x20) + 0x18) != 0) {
      item._8_8_ = *(undefined8 *)(item._8_8_ + 0x20);
    }
    LVar5 = set_assign_pos(set,(lyd_node *)item._8_8_,set->root_type);
    if (LVar5 == LY_SUCCESS) {
      ly_log_dbg(2,"SORT BEGIN");
      print_set_debug(set);
      for (ret = 0; (uint)ret < set->used; ret = ret + 1) {
        bVar4 = false;
        bVar1 = false;
        for (cmp = 1; (uint)cmp < set->used - ret; cmp = cmp + 1) {
          if (bVar4) {
            iVar6 = set_sort_compare((set->val).nodes + (uint)cmp,(set->val).nodes + (cmp - 1));
            if (-1 < iVar6) goto LAB_00214200;
LAB_00214214:
            bVar1 = true;
            plVar8 = (set->val).nodes + (cmp - 1);
            hnode._4_8_ = plVar8->node;
            lVar2 = plVar8->type;
            uVar3 = plVar8->pos;
            plVar8 = (set->val).nodes + (cmp - 1);
            plVar9 = (set->val).nodes + (uint)cmp;
            plVar8->node = plVar9->node;
            uVar7 = plVar9->pos;
            plVar8->type = plVar9->type;
            plVar8->pos = uVar7;
            plVar8 = (set->val).nodes + (uint)cmp;
            plVar8->node = (lyd_node *)hnode._4_8_;
            plVar8->type = lVar2;
            plVar8->pos = uVar3;
          }
          else {
            iVar6 = set_sort_compare((set->val).nodes + (cmp - 1),(set->val).nodes + (uint)cmp);
LAB_00214200:
            if ((!bVar4) && (0 < iVar6)) goto LAB_00214214;
            bVar4 = (bool)(bVar4 ^ 1);
          }
        }
        uStack_24 = uStack_24 + 1;
        if (!bVar1) break;
      }
      ly_log_dbg(2,"SORT END %d",(ulong)uStack_24);
      print_set_debug(set);
      if (3 < set->used) {
        if (set->ht == (ly_ht *)0x0) {
          __assert_fail("set->ht",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                        ,0x720,"int set_sort(struct lyxp_set *)");
        }
        for (ret = 0; (uint)ret < set->used; ret = ret + 1) {
          unique0x00012000 = (set->val).nodes[(uint)ret].node;
          hnode.node._0_4_ = (set->val).nodes[(uint)ret].type;
          uVar7 = lyht_hash_multi(0,(char *)((long)&hash + 4),8);
          uVar7 = lyht_hash_multi(uVar7,(char *)&hnode,4);
          uVar7 = lyht_hash_multi(uVar7,(char *)0x0,0);
          LVar5 = lyht_find(set->ht,(void *)((long)&hash + 4),uVar7,(void **)0x0);
          if (LVar5 != LY_SUCCESS) {
            __assert_fail("!lyht_find(set->ht, &hnode, hash, NULL)",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                          ,0x729,"int set_sort(struct lyxp_set *)");
          }
        }
      }
      set_local._4_4_ = uStack_24 - 1;
    }
    else {
      set_local._4_4_ = -1;
    }
  }
  else {
    set_local._4_4_ = 0;
  }
  return set_local._4_4_;
}

Assistant:

static int
set_sort(struct lyxp_set *set)
{
    uint32_t i, j;
    int ret = 0, cmp;
    ly_bool inverted, change;
    const struct lyd_node *root;
    struct lyxp_set_node item;
    struct lyxp_set_hash_node hnode;
    uint64_t hash;

    if ((set->type != LYXP_SET_NODE_SET) || (set->used < 2)) {
        return 0;
    }

    /* find first top-level node to be used as anchor for positions */
    for (root = set->tree; root->parent; root = lyd_parent(root)) {}
    for ( ; root->prev->next; root = root->prev) {}

    /* fill positions */
    if (set_assign_pos(set, root, set->root_type)) {
        return -1;
    }

#ifndef NDEBUG
    LOGDBG(LY_LDGXPATH, "SORT BEGIN");
    print_set_debug(set);
#endif

    for (i = 0; i < set->used; ++i) {
        inverted = 0;
        change = 0;

        for (j = 1; j < set->used - i; ++j) {
            /* compare node positions */
            if (inverted) {
                cmp = set_sort_compare(&set->val.nodes[j], &set->val.nodes[j - 1]);
            } else {
                cmp = set_sort_compare(&set->val.nodes[j - 1], &set->val.nodes[j]);
            }

            /* swap if needed */
            if ((inverted && (cmp < 0)) || (!inverted && (cmp > 0))) {
                change = 1;

                item = set->val.nodes[j - 1];
                set->val.nodes[j - 1] = set->val.nodes[j];
                set->val.nodes[j] = item;
            } else {
                /* whether node_pos1 should be smaller than node_pos2 or the other way around */
                inverted = !inverted;
            }
        }

        ++ret;

        if (!change) {
            break;
        }
    }

#ifndef NDEBUG
    LOGDBG(LY_LDGXPATH, "SORT END %d", ret);
    print_set_debug(set);
#endif

    /* check node hashes */
    if (set->used >= LYD_HT_MIN_ITEMS) {
        assert(set->ht);
        for (i = 0; i < set->used; ++i) {
            hnode.node = set->val.nodes[i].node;
            hnode.type = set->val.nodes[i].type;

            hash = lyht_hash_multi(0, (const char *)&hnode.node, sizeof hnode.node);
            hash = lyht_hash_multi(hash, (const char *)&hnode.type, sizeof hnode.type);
            hash = lyht_hash_multi(hash, NULL, 0);

            assert(!lyht_find(set->ht, &hnode, hash, NULL));
        }
    }

    return ret - 1;
}